

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

_Bool fy_emit_token_write_block_hints
                (fy_emitter *emit,fy_token *fyt,int flags,int indent,char *chompp)

{
  int iVar1;
  fy_atom *pfVar2;
  fy_atom *atom;
  _Bool explicit_chomp;
  char chomp;
  char *chompp_local;
  int indent_local;
  int flags_local;
  fy_token *fyt_local;
  fy_emitter *emit_local;
  
  atom._7_1_ = '\0';
  atom._6_1_ = false;
  pfVar2 = fy_token_atom(fyt);
  if (pfVar2 == (fy_atom *)0x0) {
    emit->flags = emit->flags & 0xfffffffb;
    atom._7_1_ = '-';
  }
  else {
    if (((*(uint *)&pfVar2->field_0x34 >> 0xf & 1) != 0) ||
       ((*(uint *)&pfVar2->field_0x34 >> 0x10 & 1) != 0)) {
      iVar1 = fy_emit_indent(emit);
      fy_emit_putc(emit,fyewt_indicator,iVar1 + 0x30);
      atom._6_1_ = true;
    }
    if ((*(uint *)&pfVar2->field_0x34 >> 0x12 & 1) == 0) {
      emit->flags = emit->flags & 0xfffffffb;
      atom._7_1_ = '-';
    }
    else if ((*(uint *)&pfVar2->field_0x34 >> 0x13 & 1) == 0) {
      emit->flags = emit->flags & 0xfffffffb;
    }
    else {
      emit->flags = emit->flags | 4;
      atom._7_1_ = '+';
    }
  }
  if (atom._7_1_ != '\0') {
    fy_emit_putc(emit,fyewt_indicator,(int)atom._7_1_);
  }
  *chompp = atom._7_1_;
  return atom._6_1_;
}

Assistant:

bool
fy_emit_token_write_block_hints(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent, char *chompp) {
    char chomp = '\0';
    bool explicit_chomp = false;
    struct fy_atom *atom;

    atom = fy_token_atom(fyt);
    if (!atom) {
        emit->flags &= ~FYEF_OPEN_ENDED;
        chomp = '-';
        goto out;
    }

    if (atom->starts_with_ws || atom->starts_with_lb) {
        fy_emit_putc(emit, fyewt_indicator, '0' + fy_emit_indent(emit));
        explicit_chomp = true;
    }

    if (!atom->ends_with_lb) {
        emit->flags &= ~FYEF_OPEN_ENDED;
        chomp = '-';
        goto out;
    }

    if (atom->trailing_lb) {
        emit->flags |= FYEF_OPEN_ENDED;
        chomp = '+';
        goto out;
    }
    emit->flags &= ~FYEF_OPEN_ENDED;

    out:
    if (chomp)
        fy_emit_putc(emit, fyewt_indicator, chomp);
    *chompp = chomp;
    return explicit_chomp;
}